

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode resolve_server(SessionHandle *data,connectdata *conn,_Bool *async)

{
  char *pcVar1;
  int iVar2;
  long timeoutms;
  hostname *host;
  hostname *host_00;
  CURLcode CVar3;
  Curl_dns_entry *hostaddr;
  Curl_dns_entry *local_30;
  
  timeoutms = Curl_timeleft(data,(timeval *)0x0,true);
  if ((conn->bits).reuse == true) {
    *async = false;
    return CURLE_OK;
  }
  fix_hostname(data,(connectdata *)&conn->host,host);
  pcVar1 = (conn->proxy).name;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    conn->port = (long)conn->remote_port;
    iVar2 = Curl_resolv_timeout(conn,(conn->host).name,conn->remote_port,&local_30,timeoutms);
    if (iVar2 == -2) goto LAB_00574ff6;
    if (iVar2 == 1) goto LAB_00574ff0;
    if (local_30 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"Couldn\'t resolve host \'%s\'",(conn->host).dispname);
      CVar3 = CURLE_COULDNT_RESOLVE_HOST;
      goto LAB_00575009;
    }
  }
  else {
    fix_hostname(data,(connectdata *)&conn->proxy,host_00);
    iVar2 = Curl_resolv_timeout(conn,(conn->proxy).name,(int)conn->port,&local_30,timeoutms);
    if (iVar2 == -2) {
LAB_00574ff6:
      CVar3 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_00575009;
    }
    if (iVar2 == 1) {
LAB_00574ff0:
      *async = true;
    }
    else if (local_30 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",(conn->proxy).dispname);
      CVar3 = CURLE_COULDNT_RESOLVE_PROXY;
      goto LAB_00575009;
    }
  }
  CVar3 = CURLE_OK;
LAB_00575009:
  conn->dns_entry = local_30;
  return CVar3;
}

Assistant:

static CURLcode resolve_server(struct SessionHandle *data,
                               struct connectdata *conn,
                               bool *async)
{
  CURLcode result=CURLE_OK;
  long timeout_ms = Curl_timeleft(data, NULL, TRUE);

  /*************************************************************
   * Resolve the name of the server or proxy
   *************************************************************/
  if(conn->bits.reuse)
    /* We're reusing the connection - no need to resolve anything, and
       fix_hostname() was called already in create_conn() for the re-use
       case. */
    *async = FALSE;

  else {
    /* this is a fresh connect */
    int rc;
    struct Curl_dns_entry *hostaddr;

    /* set a pointer to the hostname we display */
    fix_hostname(data, conn, &conn->host);

#ifdef USE_UNIX_SOCKETS
    if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
      /* Unix domain sockets are local. The host gets ignored, just use the
       * specified domain socket address. Do not cache "DNS entries". There is
       * no DNS involved and we already have the filesystem path available */
      const char *path = data->set.str[STRING_UNIX_SOCKET_PATH];

      hostaddr = calloc(1, sizeof(struct Curl_dns_entry));
      if(!hostaddr)
        result = CURLE_OUT_OF_MEMORY;
      else if((hostaddr->addr = Curl_unix2addr(path)) != NULL)
        hostaddr->inuse++;
      else {
        /* Long paths are not supported for now */
        if(strlen(path) >= sizeof(((struct sockaddr_un *)0)->sun_path)) {
          failf(data, "Unix socket path too long: '%s'", path);
          result = CURLE_COULDNT_RESOLVE_HOST;
        }
        else
          result = CURLE_OUT_OF_MEMORY;
        free(hostaddr);
        hostaddr = NULL;
      }
    }
    else
#endif
    if(!conn->proxy.name || !*conn->proxy.name) {
      /* If not connecting via a proxy, extract the port from the URL, if it is
       * there, thus overriding any defaults that might have been set above. */
      conn->port =  conn->remote_port; /* it is the same port */

      /* Resolve target host right on */
      rc = Curl_resolv_timeout(conn, conn->host.name, (int)conn->port,
                               &hostaddr, timeout_ms);
      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve host '%s'", conn->host.dispname);
        result =  CURLE_COULDNT_RESOLVE_HOST;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    else {
      /* This is a proxy that hasn't been resolved yet. */

      /* IDN-fix the proxy name */
      fix_hostname(data, conn, &conn->proxy);

      /* resolve proxy */
      rc = Curl_resolv_timeout(conn, conn->proxy.name, (int)conn->port,
                               &hostaddr, timeout_ms);

      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve proxy '%s'", conn->proxy.dispname);
        result = CURLE_COULDNT_RESOLVE_PROXY;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    DEBUGASSERT(conn->dns_entry == NULL);
    conn->dns_entry = hostaddr;
  }

  return result;
}